

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O2

bool VertexToDuplicate::NeedsDuplicated(ON_SubDVertex *vertex)

{
  ushort uVar1;
  bool bVar2;
  ON_SubDEdge *this;
  uint vei;
  uint i;
  bool bVar3;
  
  if ((((vertex == (ON_SubDVertex *)0x0) || (vertex->m_face_count < 2)) ||
      (vertex->m_edge_count < 2)) ||
     ((vertex->m_edges == (ON_SubDEdgePtr *)0x0 || (vertex->m_faces == (ON_SubDFace **)0x0)))) {
    bVar3 = false;
  }
  else {
    bVar2 = ON_SubDVertex::IsSmooth(vertex);
    i = 0;
    bVar3 = false;
    if (!bVar2) {
      uVar1 = vertex->m_edge_count;
      for (; bVar3 = uVar1 != i, bVar3; i = i + 1) {
        this = ON_SubDVertex::Edge(vertex,i);
        if (((this != (ON_SubDEdge *)0x0) && (bVar2 = ON_SubDEdge::IsSmooth(this), !bVar2)) &&
           (1 < this->m_face_count)) {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool VertexToDuplicate::NeedsDuplicated(
  const ON_SubDVertex* vertex
  )
{
  if ( nullptr == vertex || vertex->m_face_count < 2 || vertex->m_edge_count < 2 || nullptr == vertex->m_edges || nullptr == vertex->m_faces)
    return false;
  if (vertex->IsSmooth())
    return false;
  const unsigned int edge_count = vertex->m_edge_count;
  for (unsigned int vei = 0; vei < edge_count; vei++)
  {
    const ON_SubDEdge* edge = vertex->Edge(vei);
    if (nullptr != edge && false == edge->IsSmooth() && edge->m_face_count > 1)
      return true;
  }
  return false;
}